

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O2

void forget_objects(int percent)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  int count;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  int indices [538];
  
  if (percent != 0) {
    if (percent - 0x65U < 0xffffff9c) {
      impossible("forget_objects: bad percent %d",percent);
      return;
    }
    count = 0;
    iVar2 = 1;
    for (lVar1 = 0x38; lVar1 != 0x5420; lVar1 = lVar1 + 0x28) {
      if ((obj_descr[*(short *)((long)objects + lVar1 + -0xe)].oc_descr != (char *)0x0) &&
         (((*(byte *)((long)&objects->oc_name_idx + lVar1) & 1) != 0 ||
          (*(long *)((long)objects + lVar1 + -8) != 0)))) {
        lVar4 = (long)count;
        count = count + 1;
        indices[lVar4] = iVar2;
      }
      iVar2 = iVar2 + 1;
    }
    randomize(indices,count);
    uVar7 = (long)(percent * count + 0x32) / 100;
    uVar5 = 0;
    uVar3 = uVar7 & 0xffffffff;
    if ((int)uVar7 < 1) {
      uVar3 = uVar5;
    }
    for (; uVar5 != uVar3; uVar5 = uVar5 + 1) {
      uVar7 = (ulong)(uint)indices[uVar5];
      do {
        iVar2 = (int)uVar7;
        objects[iVar2].field_0x10 = objects[iVar2].field_0x10 & 0xfe;
        objects[iVar2].field_0x10 = objects[iVar2].field_0x10 & 0xf7;
        if (objects[iVar2].oc_uname != (char *)0x0) {
          free(objects[iVar2].oc_uname);
          objects[iVar2].oc_uname = (char *)0x0;
        }
        undiscover_object(iVar2);
        if (iVar2 - 0x5fU < 0xb) {
          uVar6 = iVar2 - 0xb;
        }
        else {
          if (10 < iVar2 - 0x54U) break;
          uVar6 = iVar2 + 0xb;
        }
        uVar7 = (ulong)uVar6;
      } while ((objects[uVar7].field_0x10 & 1) != 0);
    }
  }
  return;
}

Assistant:

void forget_objects(int percent)
{
	int i, count;
	int indices[NUM_OBJECTS];

	if (percent == 0) return;
	if (percent <= 0 || percent > 100) {
	    impossible("forget_objects: bad percent %d", percent);
	    return;
	}

	for (count = 0, i = 1; i < NUM_OBJECTS; i++)
	    if (OBJ_DESCR(objects[i]) &&
		    (objects[i].oc_name_known || objects[i].oc_uname))
		indices[count++] = i;

	randomize(indices, count);

	/* forget first % of randomized indices */
	count = ((count * percent) + 50) / 100;
	for (i = 0; i < count; i++)
	    forget_single_object(indices[i]);
}